

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O3

void __thiscall
TEST_TestFailure_GetTestFileAndLineFromFailure_Test::testBody
          (TEST_TestFailure_GetTestFileAndLineFromFailure_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  size_t sVar4;
  TestFailure f1;
  undefined1 local_88 [120];
  
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)local_88,"the failure message");
  TestFailure::TestFailure
            ((TestFailure *)(local_88 + 0x10),pUVar1,"fail.cpp",2,(SimpleString *)local_88);
  SimpleString::~SimpleString((SimpleString *)local_88);
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getTestFileName((TestFailure *)local_88);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_88);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"fail.cpp",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x3e,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_88);
  pUVar1 = UtestShell::getCurrent();
  sVar4 = TestFailure::getTestLineNumber((TestFailure *)(local_88 + 0x10));
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0xe])
            (pUVar1,1,sVar4,"LONGS_EQUAL(1, f1.getTestLineNumber()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x3f,pTVar3);
  TestFailure::~TestFailure((TestFailure *)(local_88 + 0x10));
  return;
}

Assistant:

TEST(TestFailure, GetTestFileAndLineFromFailure)
{
    TestFailure f1(test, failFileName, failLineNumber, "the failure message");
    STRCMP_EQUAL(failFileName, f1.getTestFileName().asCharString());
    LONGS_EQUAL(1, f1.getTestLineNumber());
}